

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O0

ssize_t __thiscall
booster::aio::stream_socket::write(stream_socket *this,int __fd,void *__buf,size_t __n)

{
  error_code eVar1;
  bool bVar2;
  ssize_t sVar3;
  undefined8 uVar4;
  undefined4 in_register_00000034;
  size_t n;
  error_code e;
  system_error *in_stack_ffffffffffffffc0;
  error_code local_20;
  undefined8 local_10;
  stream_socket *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  std::error_code::error_code((error_code *)this);
  sVar3 = write(this,(int)local_10,&local_20,__n);
  bVar2 = std::error_code::operator_cast_to_bool(&local_20);
  if (!bVar2) {
    return sVar3;
  }
  uVar4 = __cxa_allocate_exception(0x40);
  eVar1._M_cat = local_20._M_cat;
  eVar1._M_value = local_20._M_value;
  eVar1._4_4_ = local_20._4_4_;
  system::system_error::system_error(in_stack_ffffffffffffffc0,eVar1);
  __cxa_throw(uVar4,&system::system_error::typeinfo,system::system_error::~system_error);
}

Assistant:

size_t stream_socket::write(const_buffer const &buf)
{
	system::error_code e;
	size_t n=write(buf,e);
	if(e)
		throw system::system_error(e);
	return n;
}